

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O2

_Bool ignore_known_item_ok(player *p,object *obj)

{
  _Bool _Var1;
  
  if (p->unignoring != '\0') {
    return false;
  }
  if (cave->objects[obj->oidx] != (object *)0x0) {
    _Var1 = object_is_ignored(cave->objects[obj->oidx]);
    return _Var1;
  }
  __assert_fail("base_obj",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-ignore.c"
                ,0x26f,"_Bool ignore_known_item_ok(const struct player *, const struct object *)");
}

Assistant:

bool ignore_known_item_ok(const struct player *p, const struct object *obj)
{
	struct object *base_obj = cave->objects[obj->oidx];

	if (p->unignoring)
		return false;

	/* Get the real object and check its ignore properties */
	assert(base_obj);
	return object_is_ignored(base_obj);
}